

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

void stbtt__tesselate_cubic
               (stbtt__point *points,int *num_points,float x0,float y0,float x1,float y1,float x2,
               float y2,float x3,float y3,float objspace_flatness_squared,int n)

{
  float in_EDX;
  stbtt__point *in_RSI;
  stbtt__point *in_RDI;
  float in_XMM0_Da;
  float y3_00;
  float n_00;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float in_XMM5_Da;
  float in_XMM6_Da;
  float in_XMM7_Da;
  float unaff_retaddr;
  float in_stack_00000008;
  float my;
  float mx;
  float yb;
  float xb;
  float ya;
  float xa;
  float y23;
  float x23;
  float y12;
  float x12;
  float y01;
  float x01;
  float flatness_squared;
  float shortlen;
  float longlen;
  float dy;
  float dx;
  float dy2;
  float dx2;
  float dy1;
  float dx1;
  float dy0;
  float dx0;
  
  y3_00 = in_XMM2_Da - in_XMM0_Da;
  n_00 = in_XMM3_Da - in_XMM1_Da;
  fVar1 = in_XMM4_Da - in_XMM2_Da;
  fVar2 = in_XMM5_Da - in_XMM3_Da;
  fVar3 = in_XMM6_Da - in_XMM4_Da;
  fVar4 = in_XMM7_Da - in_XMM5_Da;
  fVar5 = in_XMM6_Da - in_XMM0_Da;
  fVar6 = in_XMM7_Da - in_XMM1_Da;
  fVar7 = sqrtf(y3_00 * y3_00 + n_00 * n_00);
  fVar1 = sqrtf(fVar1 * fVar1 + fVar2 * fVar2);
  fVar2 = sqrtf(fVar3 * fVar3 + fVar4 * fVar4);
  fVar2 = fVar7 + fVar1 + fVar2;
  fVar1 = sqrtf(fVar5 * fVar5 + fVar6 * fVar6);
  if ((int)in_EDX < 0x11) {
    if (fVar2 * fVar2 + -(fVar1 * fVar1) <= in_stack_00000008) {
      stbtt__add_point(in_RDI,(int)in_RSI->x,in_XMM6_Da,in_XMM7_Da);
      in_RSI->x = (float)((int)in_RSI->x + 1);
    }
    else {
      stbtt__tesselate_cubic
                (in_RSI,(int *)CONCAT44(in_XMM0_Da,in_XMM1_Da),in_XMM2_Da,in_XMM3_Da,in_XMM4_Da,
                 in_XMM5_Da,in_XMM6_Da,in_XMM7_Da,in_EDX,y3_00,unaff_retaddr,(int)n_00);
      stbtt__tesselate_cubic
                (in_RSI,(int *)CONCAT44(in_XMM0_Da,in_XMM1_Da),in_XMM2_Da,in_XMM3_Da,in_XMM4_Da,
                 in_XMM5_Da,in_XMM6_Da,in_XMM7_Da,in_EDX,y3_00,unaff_retaddr,(int)n_00);
    }
  }
  return;
}

Assistant:

static void stbtt__tesselate_cubic(stbtt__point *points, int *num_points, float x0, float y0, float x1, float y1, float x2, float y2, float x3, float y3, float objspace_flatness_squared, int n)
{
   // @TODO this "flatness" calculation is just made-up nonsense that seems to work well enough
   float dx0 = x1-x0;
   float dy0 = y1-y0;
   float dx1 = x2-x1;
   float dy1 = y2-y1;
   float dx2 = x3-x2;
   float dy2 = y3-y2;
   float dx = x3-x0;
   float dy = y3-y0;
   float longlen = (float) (STBTT_sqrt(dx0*dx0+dy0*dy0)+STBTT_sqrt(dx1*dx1+dy1*dy1)+STBTT_sqrt(dx2*dx2+dy2*dy2));
   float shortlen = (float) STBTT_sqrt(dx*dx+dy*dy);
   float flatness_squared = longlen*longlen-shortlen*shortlen;

   if (n > 16) // 65536 segments on one curve better be enough!
      return;

   if (flatness_squared > objspace_flatness_squared) {
      float x01 = (x0+x1)/2;
      float y01 = (y0+y1)/2;
      float x12 = (x1+x2)/2;
      float y12 = (y1+y2)/2;
      float x23 = (x2+x3)/2;
      float y23 = (y2+y3)/2;

      float xa = (x01+x12)/2;
      float ya = (y01+y12)/2;
      float xb = (x12+x23)/2;
      float yb = (y12+y23)/2;

      float mx = (xa+xb)/2;
      float my = (ya+yb)/2;

      stbtt__tesselate_cubic(points, num_points, x0,y0, x01,y01, xa,ya, mx,my, objspace_flatness_squared,n+1);
      stbtt__tesselate_cubic(points, num_points, mx,my, xb,yb, x23,y23, x3,y3, objspace_flatness_squared,n+1);
   } else {
      stbtt__add_point(points, *num_points,x3,y3);
      *num_points = *num_points+1;
   }
}